

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint *puVar5;
  uint *puVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  uint x;
  uint y;
  int iVar10;
  char *pcVar11;
  byte *pbVar12;
  stbi_uc *psVar13;
  ulong uVar14;
  uchar *puVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int left_1;
  stbi_uc *psVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  stbi_uc sVar23;
  uint uVar24;
  long in_FS_OFFSET;
  int left;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uchar *local_c8;
  uint local_bc;
  stbi_uc local_a4 [4];
  ulong local_a0;
  stbi_uc *local_98;
  int local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  stbi_uc local_58 [2];
  byte local_56 [38];
  
  iVar17 = 0x5c;
  local_84 = req_comp;
  do {
    psVar19 = s->img_buffer;
    if (psVar19 < s->img_buffer_end) {
LAB_0013eed3:
      s->img_buffer = psVar19 + 1;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar19 = s->img_buffer;
      goto LAB_0013eed3;
    }
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013ef13:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_0013f151:
      pcVar11 = "bad file";
      goto LAB_0013f17a;
    }
  }
  else {
    iVar17 = (*(s->io).eof)(s->io_user_data);
    if (iVar17 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_0013ef13;
      goto LAB_0013f151;
    }
  }
  if ((y == 0) || ((x <= (uint)(0x7fffffff / (ulong)y) && (y * x < 0x20000000)))) {
    local_60 = (uint *)px;
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    uVar24 = 0;
    local_c8 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    if (local_c8 != (uchar *)0x0) {
      local_68 = (uint *)py;
      memset(local_c8,0xff,(ulong)(y * x * 4));
      bVar9 = 0;
      do {
        if (uVar24 == 10) {
          pcVar11 = "bad format";
LAB_0013f116:
          *(char **)(in_FS_OFFSET + -0x30) = pcVar11;
          bVar2 = false;
        }
        else {
          pbVar12 = s->img_buffer;
          if (pbVar12 < s->img_buffer_end) {
LAB_0013effc:
            s->img_buffer = pbVar12 + 1;
            py = (int *)(ulong)*pbVar12;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar12 = s->img_buffer;
              goto LAB_0013effc;
            }
            py = (int *)0x0;
          }
          psVar19 = s->img_buffer;
          if (psVar19 < s->img_buffer_end) {
LAB_0013f035:
            s->img_buffer = psVar19 + 1;
            sVar23 = *psVar19;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar19 = s->img_buffer;
              goto LAB_0013f035;
            }
            sVar23 = '\0';
          }
          lVar1 = (long)(int)uVar24 * 3;
          local_58[lVar1] = sVar23;
          psVar19 = s->img_buffer;
          if (psVar19 < s->img_buffer_end) {
LAB_0013f082:
            s->img_buffer = psVar19 + 1;
            sVar7 = *psVar19;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar19 = s->img_buffer;
              goto LAB_0013f082;
            }
            sVar7 = '\0';
          }
          local_58[lVar1 + 1] = sVar7;
          pbVar12 = s->img_buffer;
          if (pbVar12 < s->img_buffer_end) {
LAB_0013f0bc:
            s->img_buffer = pbVar12 + 1;
            bVar8 = *pbVar12;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar12 = s->img_buffer;
              goto LAB_0013f0bc;
            }
            bVar8 = 0;
          }
          uVar24 = uVar24 + 1;
          local_58[lVar1 + 2] = bVar8;
          bVar9 = bVar9 | bVar8;
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013f0ee:
            if (s->img_buffer_end <= s->img_buffer) {
LAB_0013f10f:
              pcVar11 = "bad file";
              goto LAB_0013f116;
            }
          }
          else {
            iVar17 = (*(s->io).eof)(s->io_user_data);
            if (iVar17 != 0) {
              if (s->read_from_callbacks != 0) goto LAB_0013f0ee;
              goto LAB_0013f10f;
            }
          }
          bVar2 = true;
          pcVar11 = "bad format";
          if (sVar23 != '\b') goto LAB_0013f116;
        }
        iVar17 = (int)py;
        bVar3 = true;
        bVar4 = true;
        if (!bVar2) goto LAB_0013f559;
      } while (iVar17 != 0);
      iVar17 = 4 - (uint)((bVar9 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = iVar17;
      }
      if (y != 0) {
        local_8c = x * 4;
        local_80 = (ulong)y;
        local_78 = (ulong)uVar24;
        local_a0 = 0;
        do {
          if (0 < (int)uVar24) {
            local_98 = local_c8 + local_8c * (int)local_a0;
            uVar14 = 0;
            do {
              lVar1 = uVar14 * 3;
              sVar23 = local_58[lVar1 + 1];
              local_70 = uVar14;
              bVar3 = bVar4;
              if (sVar23 == '\0') {
                if (x != 0) {
                  bVar9 = local_58[lVar1 + 2];
                  psVar19 = local_98;
                  uVar20 = x;
                  do {
                    psVar13 = stbi__readval(s,(uint)bVar9,psVar19);
                    if (psVar13 == (stbi_uc *)0x0) goto LAB_0013f559;
                    psVar19 = psVar19 + 4;
                    uVar20 = uVar20 - 1;
                  } while (uVar20 != 0);
                }
              }
              else {
                psVar19 = local_98;
                uVar20 = x;
                if (sVar23 == '\x01') {
                  while (0 < (int)uVar20) {
                    pbVar12 = s->img_buffer;
                    if (pbVar12 < s->img_buffer_end) {
LAB_0013f3f5:
                      s->img_buffer = pbVar12 + 1;
                      bVar9 = *pbVar12;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar12 = s->img_buffer;
                        goto LAB_0013f3f5;
                      }
                      bVar9 = 0;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013f41d:
                      if (s->img_buffer < s->img_buffer_end) goto LAB_0013f42d;
LAB_0013f48b:
                      *(char **)(in_FS_OFFSET + -0x30) = "bad file";
LAB_0013f49b:
                      bVar2 = false;
                    }
                    else {
                      iVar10 = (*(s->io).eof)(s->io_user_data);
                      if (iVar10 != 0) {
                        if (s->read_from_callbacks != 0) goto LAB_0013f41d;
                        goto LAB_0013f48b;
                      }
LAB_0013f42d:
                      psVar13 = stbi__readval(s,(uint)local_58[lVar1 + 2],local_a4);
                      if (psVar13 == (stbi_uc *)0x0) goto LAB_0013f49b;
                      if ((int)uVar20 < (int)(uint)bVar9) {
                        bVar9 = (byte)uVar20;
                      }
                      if (bVar9 != 0) {
                        uVar16 = 0;
                        do {
                          bVar8 = local_58[lVar1 + 2];
                          uVar21 = 0x80;
                          lVar22 = 0;
                          do {
                            if ((uVar21 & bVar8) != 0) {
                              psVar19[lVar22] = local_a4[lVar22];
                            }
                            lVar22 = lVar22 + 1;
                            uVar21 = uVar21 >> 1;
                          } while (lVar22 != 4);
                          uVar16 = uVar16 + 1;
                          psVar19 = psVar19 + 4;
                        } while (uVar16 != bVar9);
                      }
                      uVar20 = uVar20 - bVar9;
                      bVar2 = true;
                    }
                    if (!bVar2) goto LAB_0013f559;
                  }
                }
                else {
                  local_bc = x;
                  if (sVar23 != '\x02') {
                    *(char **)(in_FS_OFFSET + -0x30) = "bad format";
                    goto LAB_0013f559;
                  }
                  while (0 < (int)local_bc) {
                    pbVar12 = s->img_buffer;
                    if (pbVar12 < s->img_buffer_end) {
LAB_0013f29e:
                      s->img_buffer = pbVar12 + 1;
                      bVar9 = *pbVar12;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar12 = s->img_buffer;
                        goto LAB_0013f29e;
                      }
                      bVar9 = 0;
                    }
                    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013f2c5:
                      if (s->img_buffer_end <= s->img_buffer) goto LAB_0013f311;
LAB_0013f2d5:
                      uVar20 = (uint)bVar9;
                      if ((char)bVar9 < '\0') {
                        if (uVar20 == 0x80) {
                          iVar10 = stbi__get16be(s);
                        }
                        else {
                          iVar10 = uVar20 - 0x7f;
                        }
                        if ((int)local_bc < iVar10) {
                          *(char **)(in_FS_OFFSET + -0x30) = "bad file";
LAB_0013f3b6:
                          bVar2 = false;
                        }
                        else {
                          psVar13 = stbi__readval(s,(uint)local_58[lVar1 + 2],local_a4);
                          if (psVar13 == (stbi_uc *)0x0) goto LAB_0013f3b6;
                          bVar2 = true;
                          if (0 < iVar10) {
                            iVar18 = 0;
                            do {
                              bVar9 = local_58[lVar1 + 2];
                              uVar20 = 0x80;
                              lVar22 = 0;
                              do {
                                if ((uVar20 & bVar9) != 0) {
                                  psVar19[lVar22] = local_a4[lVar22];
                                }
                                lVar22 = lVar22 + 1;
                                uVar20 = uVar20 >> 1;
                              } while (lVar22 != 4);
                              iVar18 = iVar18 + 1;
                              psVar19 = psVar19 + 4;
                            } while (iVar18 != iVar10);
                          }
                        }
                        if (bVar2) goto LAB_0013f3c0;
                        goto LAB_0013f321;
                      }
                      if ((int)local_bc <= (int)uVar20) goto LAB_0013f311;
                      local_88 = uVar20 + 1;
                      iVar18 = uVar20 + 1;
                      do {
                        psVar13 = stbi__readval(s,(uint)local_58[lVar1 + 2],psVar19);
                        if (psVar13 == (stbi_uc *)0x0) goto LAB_0013f321;
                        psVar19 = psVar19 + 4;
                        iVar18 = iVar18 + -1;
                        iVar10 = local_88;
                      } while (iVar18 != 0);
LAB_0013f3c0:
                      local_bc = local_bc - iVar10;
                      bVar2 = true;
                    }
                    else {
                      iVar10 = (*(s->io).eof)(s->io_user_data);
                      if (iVar10 == 0) goto LAB_0013f2d5;
                      if (s->read_from_callbacks != 0) goto LAB_0013f2c5;
LAB_0013f311:
                      *(char **)(in_FS_OFFSET + -0x30) = "bad file";
LAB_0013f321:
                      bVar2 = false;
                    }
                    if (!bVar2) goto LAB_0013f559;
                  }
                }
              }
              uVar14 = local_70 + 1;
            } while (uVar14 != local_78);
          }
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_80);
      }
      bVar3 = false;
LAB_0013f559:
      puVar6 = local_60;
      puVar5 = local_68;
      iVar10 = local_84;
      if (bVar3) {
        free(local_c8);
        local_c8 = (uchar *)0x0;
      }
      *puVar6 = x;
      *puVar5 = y;
      if (iVar10 != 0) {
        iVar17 = iVar10;
      }
      if (iVar10 == 0 && comp != (int *)0x0) {
        iVar17 = *comp;
      }
      puVar15 = stbi__convert_format(local_c8,4,iVar17,x,y);
      return puVar15;
    }
    pcVar11 = "outofmem";
  }
  else {
    pcVar11 = "too large";
  }
LAB_0013f17a:
  *(char **)(in_FS_OFFSET + -0x30) = pcVar11;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}